

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void puzzle_Generator(int row,int col,int games)

{
  bool bVar1;
  Board *pBVar2;
  ulong uVar3;
  int iVar4;
  Board local_b8;
  Manager local_80;
  Manager local_68;
  undefined1 local_50 [8];
  Manager manager;
  
  manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = games;
  Manager::Manager((Manager *)local_50,row,col,games);
  iVar4 = 0;
  while( true ) {
    uVar3 = (ulong)iVar4;
    if ((ulong)(((long)manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                       super__Vector_impl_data._M_start - (long)local_50) / 0x38) <= uVar3) break;
    if (0 < iVar4) {
      Board::Board(&local_b8,(Board *)((long)local_50 + uVar3 * 0x38));
      bVar1 = verify_Board((vector<Board,_std::allocator<Board>_> *)local_50,&local_b8,iVar4);
      Board::~Board(&local_b8);
      if (bVar1) {
        iVar4 = iVar4 + -2;
      }
      uVar3 = (ulong)iVar4;
    }
    pBVar2 = create_Board((Board *)((long)local_50 + uVar3 * 0x38),row,col);
    Board::operator=((Board *)((long)local_50 + uVar3 * 0x38),pBVar2);
    iVar4 = iVar4 + 1;
  }
  std::vector<Board,_std::allocator<Board>_>::vector
            (&local_80.puzzles,(vector<Board,_std::allocator<Board>_> *)local_50);
  iVar4 = manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_;
  writeBPMatrix(&local_80,
                manager.puzzles.super__Vector_base<Board,_std::allocator<Board>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,row,col);
  std::vector<Board,_std::allocator<Board>_>::~vector(&local_80.puzzles);
  std::vector<Board,_std::allocator<Board>_>::vector
            (&local_68.puzzles,(vector<Board,_std::allocator<Board>_> *)local_50);
  writeBPArmada(&local_68,iVar4);
  std::vector<Board,_std::allocator<Board>_>::~vector(&local_68.puzzles);
  std::vector<Board,_std::allocator<Board>_>::~vector
            ((vector<Board,_std::allocator<Board>_> *)local_50);
  return;
}

Assistant:

void puzzle_Generator( int row, int col, int games )
{
   Manager manager( row, col, games);

   for( int vec = 0; vec < manager.puzzles.size(); vec++ )
   {
      if( vec > 0 )
      {
          if( verify_Board( manager.puzzles, manager.puzzles[vec] , vec ) )
          {
              vec = vec - 2;
          }
      }

      manager.puzzles[vec] = *create_Board( &manager.puzzles[vec], row, col );
   }

   writeBPMatrix( manager, games, row, col );
   writeBPArmada( manager, games );
}